

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_multiword_value_Test::AppParametersTest_multiword_value_Test
          (AppParametersTest_multiword_value_Test *this)

{
  AppParametersTest_multiword_value_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__AppParametersTest_multiword_value_Test_00817f10;
  return;
}

Assistant:

TEST(AppParametersTest, multiword_value) {
	ArgWrapper args{ "/path/to/exe", "-key", "valuePart1", "valuePart2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 3U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key", u8"valuePart1", u8"valuePart2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"valuePart1 valuePart2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}